

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::Maybe<kj::OwnFd>_> * __thiscall
kj::_::NullableValue<kj::Maybe<kj::OwnFd>_>::operator=
          (NullableValue<kj::Maybe<kj::OwnFd>_> *this,NullableValue<kj::Maybe<kj::OwnFd>_> *other)

{
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      NullableValue<kj::OwnFd>::~NullableValue(&(this->field_1).value.ptr);
    }
    if (other->isSet == true) {
      Maybe<kj::OwnFd>::Maybe(&(this->field_1).value,&(other->field_1).value);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }